

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

void __thiscall
cfd::core::KeyData::KeyData
          (KeyData *this,ExtPrivkey *ext_privkey,string *child_path,ByteData *finterprint)

{
  Privkey *this_00;
  allocator local_d1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_d0;
  ByteData *local_c8;
  ExtPrivkey *local_c0;
  ExtPubkey local_b8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  Pubkey::Pubkey(&this->pubkey_);
  this_00 = &this->privkey_;
  Privkey::Privkey(this_00);
  local_c0 = &this->extprivkey_;
  ExtPrivkey::ExtPrivkey(local_c0,ext_privkey);
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  local_d0 = &this->path_;
  (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8 = &this->fingerprint_;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8,&finterprint->data_);
  if (child_path->_M_string_length != 0) {
    ::std::__cxx11::string::string((string *)&local_b8,"KeyData",&local_d1);
    ToArrayFromString((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,child_path,
                      (string *)&local_b8,'\0');
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(local_d0,&local_48);
    ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
    ::std::__cxx11::string::~string((string *)&local_b8);
  }
  ExtPrivkey::GetExtPubkey(&local_b8,ext_privkey);
  ExtPubkey::operator=(&this->extpubkey_,&local_b8);
  ExtPubkey::~ExtPubkey(&local_b8);
  Privkey::Privkey((Privkey *)&local_b8,&ext_privkey->privkey_);
  Privkey::operator=(this_00,(Privkey *)&local_b8);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b8);
  Privkey::GetPubkey((Pubkey *)&local_b8,this_00);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,&local_b8);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b8);
  return;
}

Assistant:

KeyData::KeyData(
    const ExtPrivkey& ext_privkey, const std::string& child_path,
    const ByteData& finterprint)
    : extprivkey_(ext_privkey), fingerprint_(finterprint) {
  if (!child_path.empty()) {
    path_ = ToArrayFromString(child_path, "KeyData", 0);
  }
  extpubkey_ = ext_privkey.GetExtPubkey();
  privkey_ = ext_privkey.GetPrivkey();
  pubkey_ = privkey_.GetPubkey();
}